

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

const_iterator __thiscall
QHash<QNetworkRequest::Attribute,_QVariant>::constFindImpl<QNetworkRequest::Attribute>
          (QHash<QNetworkRequest::Attribute,_QVariant> *this,Attribute *key)

{
  Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *this_00;
  Data *pDVar1;
  ulong uVar2;
  Bucket BVar3;
  const_iterator cVar4;
  
  this_00 = this->d;
  if ((this_00 != (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)0x0) &&
     (this_00->size != 0)) {
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::
            findBucket<QNetworkRequest::Attribute>(this_00,key);
    if ((BVar3.span)->offsets[BVar3.index] != 0xff) {
      pDVar1 = this->d;
      uVar2 = ((long)BVar3.span - (long)pDVar1->spans) / 0x90 << 7 | BVar3.index;
      goto LAB_0019570a;
    }
  }
  uVar2 = 0;
  pDVar1 = (Data *)0x0;
LAB_0019570a:
  cVar4.i.bucket = uVar2;
  cVar4.i.d = pDVar1;
  return (const_iterator)cVar4.i;
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return end();
        return const_iterator({d, it.toBucketIndex(d)});
    }